

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::roundToIntegral(IEEEFloat *this,roundingMode rounding_mode)

{
  uint uVar1;
  opStatus oVar2;
  uint64_t uVar3;
  byte bVar4;
  IEEEFloat MagicConstant;
  APInt IntegerConstant;
  
  if ((this->field_0x12 & 6) == 0 || (this->field_0x12 & 7) == 3) {
    uVar1 = this->semantics->precision;
  }
  else {
    uVar1 = this->semantics->precision;
    if ((int)uVar1 <= this->exponent + 1) {
      return opOK;
    }
  }
  uVar3 = NextPowerOf2((ulong)uVar1);
  APInt::APInt(&IntegerConstant,(uint)uVar3,1,false);
  APInt::operator<<=(&IntegerConstant,this->semantics->precision - 1);
  IEEEFloat(&MagicConstant,this->semantics);
  oVar2 = convertFromAPInt(&MagicConstant,&IntegerConstant,false,rmNearestTiesToEven);
  bVar4 = this->field_0x12 & 8;
  MagicConstant._18_1_ = MagicConstant._18_1_ & 0xf7 | bVar4;
  if ((oVar2 == opOK) &&
     (oVar2 = add(this,&MagicConstant,rounding_mode),
     (oVar2 & (opUnderflow|opOverflow|opDivByZero|opInvalidOp)) == opOK)) {
    oVar2 = subtract(this,&MagicConstant,rounding_mode);
    if ((bVar4 != 0) != (bool)((this->field_0x12 & 8) >> 3)) {
      this->field_0x12 = this->field_0x12 ^ 8;
    }
  }
  ~IEEEFloat(&MagicConstant);
  APInt::~APInt(&IntegerConstant);
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::roundToIntegral(roundingMode rounding_mode) {
  opStatus fs;

  // If the exponent is large enough, we know that this value is already
  // integral, and the arithmetic below would potentially cause it to saturate
  // to +/-Inf.  Bail out early instead.
  if (isFiniteNonZero() && exponent+1 >= (int)semanticsPrecision(*semantics))
    return opOK;

  // The algorithm here is quite simple: we add 2^(p-1), where p is the
  // precision of our format, and then subtract it back off again.  The choice
  // of rounding modes for the addition/subtraction determines the rounding mode
  // for our integral rounding as well.
  // NOTE: When the input value is negative, we do subtraction followed by
  // addition instead.
  APInt IntegerConstant(NextPowerOf2(semanticsPrecision(*semantics)), 1);
  IntegerConstant <<= semanticsPrecision(*semantics)-1;
  IEEEFloat MagicConstant(*semantics);
  fs = MagicConstant.convertFromAPInt(IntegerConstant, false,
                                      rmNearestTiesToEven);
  MagicConstant.sign = sign;

  if (fs != opOK)
    return fs;

  // Preserve the input sign so that we can handle 0.0/-0.0 cases correctly.
  bool inputSign = isNegative();

  fs = add(MagicConstant, rounding_mode);
  if (fs != opOK && fs != opInexact)
    return fs;

  fs = subtract(MagicConstant, rounding_mode);

  // Restore the input sign.
  if (inputSign != isNegative())
    changeSign();

  return fs;
}